

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O3

SourceLocation * __thiscall
flow::lang::ParamList::location(SourceLocation *__return_storage_ptr__,ParamList *this)

{
  FilePos *pFVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  Expr *pEVar5;
  Expr *pEVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  puVar3 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->values_).
           super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 == puVar4) {
    (__return_storage_ptr__->filename)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->filename).field_2;
    (__return_storage_ptr__->filename)._M_string_length = 0;
    (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->begin).line = 1;
    (__return_storage_ptr__->begin).column = 1;
    *(undefined8 *)&(__return_storage_ptr__->begin).offset = 0x100000000;
    (__return_storage_ptr__->end).column = 1;
    uVar12 = 0;
  }
  else {
    pEVar5 = (puVar3->_M_t).
             super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
             super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    pFVar1 = (FilePos *)((long)&(pEVar5->super_ASTNode).location_ + 0x20);
    uVar8 = pFVar1->line;
    uVar9 = pFVar1->column;
    uVar2 = *(uint *)((long)&(pEVar5->super_ASTNode).location_ + 0x28);
    pEVar6 = puVar4[-1]._M_t.
             super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
             super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
    pFVar1 = (FilePos *)((long)&(pEVar6->super_ASTNode).location_ + 0x2c);
    uVar10 = pFVar1->line;
    uVar11 = pFVar1->column;
    uVar12 = *(uint *)((long)&(pEVar6->super_ASTNode).location_ + 0x34);
    (__return_storage_ptr__->filename)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->filename).field_2;
    lVar7 = *(long *)&(pEVar5->super_ASTNode).location_.filename._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar7,
               *(size_type *)((long)&(pEVar5->super_ASTNode).location_ + 8) + lVar7);
    (__return_storage_ptr__->begin).line = uVar8;
    (__return_storage_ptr__->begin).column = uVar9;
    (__return_storage_ptr__->begin).offset = uVar2;
    (__return_storage_ptr__->end).line = uVar10;
    (__return_storage_ptr__->end).column = uVar11;
  }
  (__return_storage_ptr__->end).offset = uVar12;
  return __return_storage_ptr__;
}

Assistant:

SourceLocation ParamList::location() const {
  if (values_.empty()) return SourceLocation();

  return SourceLocation(front()->location().filename, front()->location().begin,
                      back()->location().end);
}